

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hebrwcal.cpp
# Opt level: O3

int32_t __thiscall
icu_63::HebrewCalendar::handleComputeMonthStart
          (HebrewCalendar *this,int32_t eyear,int32_t month,UBool param_3)

{
  uint in_EAX;
  int iVar1;
  int32_t iVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  int16_t (*paiVar6) [3];
  int iVar7;
  UErrorCode status;
  undefined8 uStack_38;
  
  uStack_38 = (ulong)in_EAX;
  if (month < 0) {
    iVar1 = eyear * 0xc + 5;
    do {
      eyear = eyear - 1;
      iVar5 = iVar1 % 0x13;
      iVar7 = 0xc;
      if (iVar5 < 0) {
        iVar7 = -7;
      }
      iVar1 = iVar1 + -0xc;
      month = month + (iVar5 < iVar7 ^ 0xd);
    } while (month < 0);
  }
  else if (0xc < (uint)month) {
    iVar1 = eyear * 0xc + 0x11;
    do {
      eyear = eyear + 1;
      iVar7 = 0xc;
      if (iVar1 % 0x13 < 0) {
        iVar7 = -7;
      }
      month = (month + (uint)(iVar1 % 0x13 < iVar7)) - 0xd;
      iVar1 = iVar1 + 0xc;
    } while (0xc < (uint)month);
  }
  iVar2 = startOfYear(eyear,(UErrorCode *)((long)&uStack_38 + 4));
  iVar1 = 0;
  if (uStack_38._4_4_ < 1) {
    if (month != 0) {
      iVar7 = (eyear * 0xc + 0x11) % 0x13;
      iVar1 = 0xc;
      if (iVar7 < 0) {
        iVar1 = -7;
      }
      iVar3 = (*(this->super_Calendar).super_UObject._vptr_UObject[0x23])(this,(ulong)(uint)eyear);
      iVar5 = iVar3 + -0x1e;
      if (iVar3 < 0x17d) {
        iVar5 = iVar3;
      }
      uVar4 = 1;
      if (iVar5 - 0x161U < 3) {
        uVar4 = (ulong)(iVar5 - 0x161U);
      }
      paiVar6 = LEAP_MONTH_START;
      if (iVar7 < iVar1) {
        paiVar6 = MONTH_START;
      }
      iVar2 = iVar2 + paiVar6[(uint)month][uVar4];
    }
    iVar1 = iVar2 + 0x54f5d;
  }
  return iVar1;
}

Assistant:

int32_t HebrewCalendar::handleComputeMonthStart(int32_t eyear, int32_t month, UBool /*useMonth*/) const {
    UErrorCode status = U_ZERO_ERROR;
    // Resolve out-of-range months.  This is necessary in order to
    // obtain the correct year.  We correct to
    // a 12- or 13-month year (add/subtract 12 or 13, depending
    // on the year) but since we _always_ number from 0..12, and
    // the leap year determines whether or not month 5 (Adar 1)
    // is present, we allow 0..12 in any given year.
    while (month < 0) {
        month += monthsInYear(--eyear);
    }
    // Careful: allow 0..12 in all years
    while (month > 12) {
        month -= monthsInYear(eyear++);
    }

    int32_t day = startOfYear(eyear, status);

    if(U_FAILURE(status)) {
        return 0;
    }

    if (month != 0) {
        if (isLeapYear(eyear)) {
            day += LEAP_MONTH_START[month][yearType(eyear)];
        } else {
            day += MONTH_START[month][yearType(eyear)];
        }
    }

    return (int) (day + 347997);
}